

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_widget_layout_states nk_widget(nk_rect *bounds,nk_context *ctx)

{
  float fVar1;
  uint uVar2;
  nk_panel *pnVar3;
  nk_widget_layout_states nVar4;
  nk_widget_layout_states nVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x4ac8,
                  "enum nk_widget_layout_states nk_widget(struct nk_rect *, const struct nk_context *)"
                 );
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x4ac9,
                  "enum nk_widget_layout_states nk_widget(struct nk_rect *, const struct nk_context *)"
                 );
  }
  if (ctx->current->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x4aca,
                  "enum nk_widget_layout_states nk_widget(struct nk_rect *, const struct nk_context *)"
                 );
  }
  nk_panel_alloc_space(bounds,ctx);
  pnVar3 = ctx->current->layout;
  uVar2 = pnVar3->flags;
  if (-1 < (short)uVar2) {
    if ((uVar2 >> 0xd & 1) != 0) {
      __assert_fail("!(layout->flags & NK_WINDOW_HIDDEN)",
                    "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                    ,0x4adb,
                    "enum nk_widget_layout_states nk_widget(struct nk_rect *, const struct nk_context *)"
                   );
    }
    if ((uVar2 >> 0xe & 1) == 0) {
      fVar11 = (pnVar3->clip).x;
      fVar10 = (pnVar3->clip).y;
      fVar9 = (pnVar3->clip).w;
      fVar7 = (pnVar3->clip).h;
      fVar12 = bounds->w;
      fVar1 = bounds->h;
      fVar8 = (float)(int)bounds->x;
      fVar6 = (float)(int)bounds->y;
      bounds->x = fVar8;
      bounds->y = fVar6;
      bounds->w = (float)(int)fVar12;
      bounds->h = (float)(int)fVar1;
      fVar13 = (float)(int)fVar11;
      fVar11 = (float)(int)fVar9 + fVar13;
      nVar4 = NK_WIDGET_INVALID;
      nVar5 = NK_WIDGET_INVALID;
      if ((fVar8 <= fVar11) && (fVar9 = (float)(int)fVar12 + fVar8, nVar5 = nVar4, fVar13 <= fVar9))
      {
        fVar12 = (float)(int)fVar10;
        fVar10 = (float)(int)fVar7 + fVar12;
        if ((fVar6 <= fVar10) && (fVar7 = (float)(int)fVar1 + fVar6, fVar12 <= fVar7)) {
          if (fVar8 <= fVar13) {
            fVar8 = fVar13;
          }
          fVar1 = (ctx->input).mouse.pos.x;
          nVar5 = NK_WIDGET_ROM;
          if (fVar8 <= fVar1) {
            if (fVar9 <= fVar11) {
              fVar11 = fVar9;
            }
            fVar11 = fVar11 - fVar8;
            if (fVar11 <= 0.0) {
              fVar11 = 0.0;
            }
            if (fVar1 < fVar11 + fVar8) {
              if (fVar6 <= fVar12) {
                fVar6 = fVar12;
              }
              if (fVar7 <= fVar10) {
                fVar10 = fVar7;
              }
              fVar10 = fVar10 - fVar6;
              if (fVar10 <= 0.0) {
                fVar10 = 0.0;
              }
              fVar11 = (ctx->input).mouse.pos.y;
              nVar5 = NK_WIDGET_ROM - (fVar11 < fVar10 + fVar6 && fVar6 <= fVar11);
            }
          }
        }
      }
      return nVar5;
    }
    __assert_fail("!(layout->flags & NK_WINDOW_CLOSED)",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x4adc,
                  "enum nk_widget_layout_states nk_widget(struct nk_rect *, const struct nk_context *)"
                 );
  }
  __assert_fail("!(layout->flags & NK_WINDOW_MINIMIZED)",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x4ada,
                "enum nk_widget_layout_states nk_widget(struct nk_rect *, const struct nk_context *)"
               );
}

Assistant:

NK_API enum nk_widget_layout_states
nk_widget(struct nk_rect *bounds, const struct nk_context *ctx)
{
    struct nk_rect c, v;
    struct nk_window *win;
    struct nk_panel *layout;
    const struct nk_input *in;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return NK_WIDGET_INVALID;

    /* allocate space and check if the widget needs to be updated and drawn */
    nk_panel_alloc_space(bounds, ctx);
    win = ctx->current;
    layout = win->layout;
    in = &ctx->input;
    c = layout->clip;

    /*  if one of these triggers you forgot to add an `if` condition around either
        a window, group, popup, combobox or contextual menu `begin` and `end` block.
        Example:
            if (nk_begin(...) {...} nk_end(...); or
            if (nk_group_begin(...) { nk_group_end(...);} */
    NK_ASSERT(!(layout->flags & NK_WINDOW_MINIMIZED));
    NK_ASSERT(!(layout->flags & NK_WINDOW_HIDDEN));
    NK_ASSERT(!(layout->flags & NK_WINDOW_CLOSED));

    /* need to convert to int here to remove floating point errors */
    bounds->x = (float)((int)bounds->x);
    bounds->y = (float)((int)bounds->y);
    bounds->w = (float)((int)bounds->w);
    bounds->h = (float)((int)bounds->h);

    c.x = (float)((int)c.x);
    c.y = (float)((int)c.y);
    c.w = (float)((int)c.w);
    c.h = (float)((int)c.h);

    nk_unify(&v, &c, bounds->x, bounds->y, bounds->x + bounds->w, bounds->y + bounds->h);
    if (!NK_INTERSECT(c.x, c.y, c.w, c.h, bounds->x, bounds->y, bounds->w, bounds->h))
        return NK_WIDGET_INVALID;
    if (!NK_INBOX(in->mouse.pos.x, in->mouse.pos.y, v.x, v.y, v.w, v.h))
        return NK_WIDGET_ROM;
    return NK_WIDGET_VALID;
}